

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.h
# Opt level: O0

fio_str_info_s *
fio_str_vprintf(fio_str_info_s *__return_storage_ptr__,fio_str_s_conflict *s,char *format,
               __va_list_tag *argv)

{
  int iVar1;
  size_t sVar2;
  undefined8 uStack_38;
  int len;
  va_list argv_cpy;
  __va_list_tag *argv_local;
  char *format_local;
  fio_str_s_conflict *s_local;
  
  argv_cpy[0].overflow_arg_area = argv->reg_save_area;
  uStack_38._0_4_ = argv->gp_offset;
  uStack_38._4_4_ = argv->fp_offset;
  argv_cpy[0]._0_8_ = argv->overflow_arg_area;
  argv_cpy[0].reg_save_area = argv;
  iVar1 = vsnprintf((char *)0x0,0,format,&uStack_38);
  if (iVar1 < 1) {
    fio_str_info(__return_storage_ptr__,s);
  }
  else {
    sVar2 = fio_str_len(s);
    fio_str_resize(__return_storage_ptr__,s,(long)iVar1 + sVar2);
    vsnprintf(__return_storage_ptr__->data + (__return_storage_ptr__->len - (long)iVar1),
              (long)(iVar1 + 1),format,argv_cpy[0].reg_save_area);
  }
  return __return_storage_ptr__;
}

Assistant:

FIO_FUNC __attribute__((format(printf, 2, 0))) fio_str_info_s
fio_str_vprintf(fio_str_s *s, const char *format, va_list argv) {
  va_list argv_cpy;
  va_copy(argv_cpy, argv);
  int len = vsnprintf(NULL, 0, format, argv_cpy);
  va_end(argv_cpy);
  if (len <= 0)
    return fio_str_info(s);
  fio_str_info_s state = fio_str_resize(s, len + fio_str_len(s));
  vsnprintf(state.data + (state.len - len), len + 1, format, argv);
  return state;
}